

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::parseStringTemplate(SQParser *this)

{
  bool bVar1;
  SQAllocContext pSVar2;
  SQParser *this_00;
  GetFieldExpr *args_00;
  Arena *args_1;
  CallExpr *pCVar3;
  SQParser *in_RDI;
  Expr *arg_1;
  iterator __end2;
  iterator __begin2;
  sqvector<SQCompilation::Expr_*,_unsigned_int> *__range2;
  CallExpr *call;
  Expr *callee;
  LiteralExpr *fmt;
  Expr *result;
  Expr *arg;
  SQInteger tok;
  SQInteger fmtC;
  SQInteger fmtL;
  char buffer [64];
  sqvector<SQCompilation::Expr_*,_unsigned_int> args;
  sqvector<char,_unsigned_int> formatString;
  int idx;
  SQInteger c;
  SQInteger l;
  Expr *in_stack_fffffffffffffe58;
  sqvector<SQCompilation::Expr_*,_unsigned_int> *in_stack_fffffffffffffe60;
  CallExpr *this_01;
  CallExpr *in_stack_fffffffffffffe68;
  SQParser *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined1 args_2;
  char *in_stack_fffffffffffffe80;
  LiteralExpr *in_stack_fffffffffffffe88;
  SQParser *in_stack_fffffffffffffe90;
  CallExpr *local_108;
  SQParser *local_e0;
  SQExpressionContext in_stack_ffffffffffffff2c;
  SQParser *in_stack_ffffffffffffff30;
  long lVar4;
  char local_a8 [80];
  sqvector<SQCompilation::Expr_*,_unsigned_int> local_58;
  sqvector<char,_unsigned_int> local_40;
  int local_24;
  SQInteger local_20;
  SQInteger local_18;
  SQParser *local_8;
  
  (in_RDI->_lex)._state = LS_TEMPALTE;
  (in_RDI->_lex)._expectedToken = 0x151;
  local_18 = line(in_RDI);
  local_20 = column(in_RDI);
  Lex(in_stack_fffffffffffffe70);
  local_24 = 0;
  pSVar2 = SQCompilationContext::allocContext(in_RDI->_ctx);
  sqvector<char,_unsigned_int>::sqvector(&local_40,pSVar2);
  pSVar2 = SQCompilationContext::allocContext(in_RDI->_ctx);
  sqvector<SQCompilation::Expr_*,_unsigned_int>::sqvector(&local_58,pSVar2);
  local_a8[0x30] = '\0';
  local_a8[0x31] = '\0';
  local_a8[0x32] = '\0';
  local_a8[0x33] = '\0';
  local_a8[0x34] = '\0';
  local_a8[0x35] = '\0';
  local_a8[0x36] = '\0';
  local_a8[0x37] = '\0';
  local_a8[0x38] = '\0';
  local_a8[0x39] = '\0';
  local_a8[0x3a] = '\0';
  local_a8[0x3b] = '\0';
  local_a8[0x3c] = '\0';
  local_a8[0x3d] = '\0';
  local_a8[0x3e] = '\0';
  local_a8[0x3f] = '\0';
  local_a8[0x20] = '\0';
  local_a8[0x21] = '\0';
  local_a8[0x22] = '\0';
  local_a8[0x23] = '\0';
  local_a8[0x24] = '\0';
  local_a8[0x25] = '\0';
  local_a8[0x26] = '\0';
  local_a8[0x27] = '\0';
  local_a8[0x28] = '\0';
  local_a8[0x29] = '\0';
  local_a8[0x2a] = '\0';
  local_a8[0x2b] = '\0';
  local_a8[0x2c] = '\0';
  local_a8[0x2d] = '\0';
  local_a8[0x2e] = '\0';
  local_a8[0x2f] = '\0';
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  line(in_RDI);
  column(in_RDI);
  while (lVar4 = in_RDI->_token, lVar4 != 0) {
    if (((lVar4 != 0x151) && (lVar4 != 0x152)) && (lVar4 != 0x153)) {
      reportDiagnostic(in_RDI,0x19,"STRING_LITERAL");
      local_8 = (SQParser *)0x0;
      goto LAB_001bbcb2;
    }
    appendStringData((sqvector<char,_unsigned_int> *)in_stack_fffffffffffffe60,
                     (SQChar *)in_stack_fffffffffffffe58);
    if (lVar4 == 0x153) break;
    local_24 = local_24 + 1;
    snprintf(local_a8,0x40,"%d");
    appendStringData((sqvector<char,_unsigned_int> *)in_stack_fffffffffffffe60,
                     (SQChar *)in_stack_fffffffffffffe58);
    (in_RDI->_lex)._expectedToken = -1;
    (in_RDI->_lex)._state = LS_REGULAR;
    Lex(in_stack_fffffffffffffe70);
    in_stack_ffffffffffffff30 =
         (SQParser *)Expression(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    sqvector<SQCompilation::Expr_*,_unsigned_int>::push_back
              (in_stack_fffffffffffffe60,(Expr **)in_stack_fffffffffffffe58);
    if (in_RDI->_token != 0x7d) {
      reportDiagnostic(in_RDI,0x19,"}");
      local_8 = (SQParser *)0x0;
      goto LAB_001bbcb2;
    }
    in_stack_ffffffffffffff2c = CONCAT13(0x7d,(int3)in_stack_ffffffffffffff2c);
    sqvector<char,_unsigned_int>::push_back
              ((sqvector<char,_unsigned_int> *)in_stack_fffffffffffffe60,
               (char *)in_stack_fffffffffffffe58);
    (in_RDI->_lex)._state = LS_TEMPALTE;
    (in_RDI->_lex)._expectedToken = 0x152;
    Lex(in_stack_fffffffffffffe70);
  }
  sqvector<char,_unsigned_int>::push_back
            ((sqvector<char,_unsigned_int> *)in_stack_fffffffffffffe60,
             (char *)in_stack_fffffffffffffe58);
  sqvector<char,_unsigned_int>::operator[](&local_40,0);
  newStringLiteral(in_stack_fffffffffffffe70,(SQChar *)in_stack_fffffffffffffe68);
  local_e0 = (SQParser *)
             setCoordinates<SQCompilation::LiteralExpr>
                       (in_stack_fffffffffffffe70,(LiteralExpr *)in_stack_fffffffffffffe68,
                        (SQInteger)in_stack_fffffffffffffe60,(SQInteger)in_stack_fffffffffffffe58);
  bVar1 = sqvector<SQCompilation::Expr_*,_unsigned_int>::empty(&local_58);
  if (!bVar1) {
    this_00 = (SQParser *)
              newNode<SQCompilation::GetFieldExpr,SQCompilation::LiteralExpr*,char_const*,bool,bool>
                        (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe80,SUB81((ulong)in_stack_fffffffffffffe78 >> 0x38,0)
                         ,SUB81((ulong)in_stack_fffffffffffffe78 >> 0x30,0));
    args_2 = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
    args_00 = setCoordinates<SQCompilation::GetFieldExpr>
                        (in_stack_fffffffffffffe70,(GetFieldExpr *)in_stack_fffffffffffffe68,
                         (SQInteger)in_stack_fffffffffffffe60,(SQInteger)in_stack_fffffffffffffe58);
    args_1 = arena(in_RDI);
    newNode<SQCompilation::CallExpr,Arena*,SQCompilation::Expr*,bool>
              (this_00,(Arena *)args_00,(Expr *)args_1,(bool)args_2);
    local_e0 = (SQParser *)
               setCoordinates<SQCompilation::CallExpr>
                         (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                          (SQInteger)in_stack_fffffffffffffe60,(SQInteger)in_stack_fffffffffffffe58)
    ;
    in_stack_fffffffffffffe70 = local_e0;
    local_108 = (CallExpr *)sqvector<SQCompilation::Expr_*,_unsigned_int>::begin(&local_58);
    pCVar3 = (CallExpr *)sqvector<SQCompilation::Expr_*,_unsigned_int>::end(&local_58);
    this_01 = pCVar3;
    for (; local_108 != pCVar3;
        local_108 = (CallExpr *)&(local_108->super_Expr).super_Node._coordinates) {
      CallExpr::addArgument(this_01,in_stack_fffffffffffffe58);
    }
  }
  (in_RDI->_lex)._expectedToken = -1;
  (in_RDI->_lex)._state = LS_REGULAR;
  Lex(in_stack_fffffffffffffe70);
  local_8 = local_e0;
LAB_001bbcb2:
  sqvector<SQCompilation::Expr_*,_unsigned_int>::~sqvector
            ((sqvector<SQCompilation::Expr_*,_unsigned_int> *)0x1bbcbf);
  sqvector<char,_unsigned_int>::~sqvector((sqvector<char,_unsigned_int> *)0x1bbccc);
  return (Expr *)local_8;
}

Assistant:

Expr *SQParser::parseStringTemplate() {

    // '$' TK_TEMPLATE_PREFIX? (arg TK_TEMPLATE_INFIX)* arg? TK_TEMPLATE_SUFFX

    _lex._state = LS_TEMPALTE;
    _lex._expectedToken = TK_TEMPLATE_PREFIX;

    SQInteger l = line(), c = column();

    Lex();
    int idx = 0;

    sqvector<SQChar> formatString(_ctx.allocContext());
    sqvector<Expr *> args(_ctx.allocContext());
    char buffer[64] = {0};

    SQInteger fmtL = line(), fmtC = column();
    SQInteger tok = -1;

    while ((tok = _token) != SQUIRREL_EOB) {

      if (tok != TK_TEMPLATE_PREFIX && tok != TK_TEMPLATE_INFIX && tok != TK_TEMPLATE_SUFFIX) {
          reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("STRING_LITERAL"));
          return nullptr;
      }

      appendStringData(formatString, _lex._svalue);
      if (tok != TK_TEMPLATE_SUFFIX) {
        snprintf(buffer, sizeof buffer, "%d", idx++);
        appendStringData(formatString, buffer);
        _lex._expectedToken = -1;
        _lex._state = LS_REGULAR;
        Lex();
        Expr *arg = Expression(SQE_FUNCTION_ARG);
        args.push_back(arg);

        if (_token != _SC('}')) {
            reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("}"));
            return nullptr;
        }

        formatString.push_back(_SC('}'));

        _lex._state = LS_TEMPALTE;
        _lex._expectedToken = TK_TEMPLATE_INFIX;
      }
      else {
        break;
      }
      Lex();
    }

    formatString.push_back('\0');

    Expr *result = nullptr;
    LiteralExpr *fmt = setCoordinates(newStringLiteral(&formatString[0]), fmtL, fmtC);

    if (args.empty()) {
      result = fmt;
    }
    else {
      Expr *callee = setCoordinates(newNode<GetFieldExpr>(fmt, "subst", false, /* force type method */ true), l, c);
      CallExpr *call = setCoordinates(newNode<CallExpr>(arena(), callee, false), l, c);

      for (Expr *arg : args)
        call->addArgument(arg);

      result = call;
    }

    _lex._expectedToken = -1;
    _lex._state = LS_REGULAR;
    Lex();

    return result;
}